

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxLPBase(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::LPRowSetBase(&this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,-1,-1);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::LPColSetBase(&this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,-1,-1);
  (this->
  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).
  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._vptr_ClassArray = (_func_int **)&PTR__SPxLPBase_003b3ef0;
  (this->
  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).
  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._vptr_ClassArray = (_func_int **)&PTR__SPxLPBase_003b4190;
  (this->offset).m_backend.fpclass = cpp_dec_float_finite;
  (this->offset).m_backend.prec_elem = 10;
  (this->offset).m_backend.data._M_elems[0] = 0;
  (this->offset).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->offset).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->offset).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->offset).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->offset).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->offset).m_backend.data._M_elems + 0x25) = 0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clear(this);
  return;
}

Assistant:

SPxLPBase()
   {
      SPxLPBase<R>::clear(); // clear is virtual.

      assert(isConsistent());
   }